

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# provider_child.c
# Opt level: O0

int ossl_provider_up_ref_parent(OSSL_PROVIDER *prov,int activate)

{
  code *pcVar1;
  void *pvVar2;
  OSSL_CORE_HANDLE *pOVar3;
  undefined4 in_ESI;
  OSSL_PROVIDER *in_RDI;
  child_prov_globals *gbl;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar4;
  
  ossl_provider_libctx(in_RDI);
  pvVar2 = ossl_lib_ctx_get_data
                     ((OSSL_LIB_CTX *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                      (int)((ulong)in_RDI >> 0x20),
                      (OSSL_LIB_CTX_METHOD *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
  if (pvVar2 == (void *)0x0) {
    iVar4 = 0;
  }
  else {
    pcVar1 = *(code **)((long)pvVar2 + 0x48);
    pOVar3 = ossl_provider_get_parent(in_RDI);
    iVar4 = (*pcVar1)(pOVar3,in_ESI);
  }
  return iVar4;
}

Assistant:

int ossl_provider_up_ref_parent(OSSL_PROVIDER *prov, int activate)
{
    struct child_prov_globals *gbl;

    gbl = ossl_lib_ctx_get_data(ossl_provider_libctx(prov),
                                OSSL_LIB_CTX_CHILD_PROVIDER_INDEX,
                                &child_prov_ossl_ctx_method);
    if (gbl == NULL)
        return 0;

    return gbl->c_prov_up_ref(ossl_provider_get_parent(prov), activate);
}